

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::Deserialize(DMatrix *this,string *filename)

{
  byte bVar1;
  ulong uVar2;
  ostream *poVar3;
  value_type pvVar4;
  reference ppvVar5;
  char *in_RDI;
  char *unaff_retaddr;
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  FILE *in_stack_000000b8;
  size_t i;
  FILE *file;
  Logger *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *in_stack_fffffffffffffe60;
  DMatrix *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  string *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  LogSeverity severity;
  ulong local_e8;
  FILE *in_stack_ffffffffffffff40;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc8;
  FILE *in_stack_ffffffffffffffd0;
  Logger local_14 [3];
  char *mode;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  mode = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Reset(in_stack_fffffffffffffe80);
    std::__cxx11::string::c_str();
    OpenFileOrDie(unaff_retaddr,mode);
    ReadDataFromDisk(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    ReadDataFromDisk(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    ReadDataFromDisk(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::resize(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    for (local_e8 = 0; local_e8 < *(uint *)(in_RDI + 0x10); local_e8 = local_e8 + 1) {
      pvVar4 = (value_type)operator_new(0x18);
      std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
                ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x202f48);
      ppvVar5 = std::
                vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                              *)(in_RDI + 0x18),local_e8);
      *ppvVar5 = pvVar4;
      std::
      vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                    *)(in_RDI + 0x18),local_e8);
      ReadVectorFromFile<xLearn::Node>
                (in_stack_ffffffffffffffd0,
                 (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)in_stack_ffffffffffffffc8);
    }
    ReadVectorFromFile<float>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    ReadVectorFromFile<float>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    ReadDataFromDisk(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    ReadDataFromDisk(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    Close(in_stack_ffffffffffffff40);
    return;
  }
  Logger::Logger(local_14,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
             ,&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Deserialize",&local_71);
  poVar3 = Logger::Start(severity,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffea8);
  poVar3 = std::operator<<(poVar3,"CHECK failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16d);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"!filename.empty()");
  poVar3 = std::operator<<(poVar3," = ");
  bVar1 = std::__cxx11::string::empty();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar1 ^ 1));
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Logger::~Logger(in_stack_fffffffffffffe40);
  abort();
}

Assistant:

void Deserialize(const std::string& filename) {
    CHECK(!filename.empty());
    this->Reset();
#ifndef _MSC_VER
    FILE* file = OpenFileOrDie(filename.c_str(), "r");
#else
    FILE* file = OpenFileOrDie(filename.c_str(), "rb");
#endif
    // Read hash_value
    ReadDataFromDisk(file, (char*)&hash_value_1, sizeof(hash_value_1));
    ReadDataFromDisk(file, (char*)&hash_value_2, sizeof(hash_value_2));
    // Read row_length
    ReadDataFromDisk(file, (char*)&row_length, sizeof(row_length));
    CHECK_GE(row_length, 0);
    // Read row
    row.resize(row_length, nullptr);
    for (size_t i = 0; i < row_length; ++i) {
      row[i] = new SparseRow;
      ReadVectorFromFile(file, *(row[i]));
    }
    // Read Y
    ReadVectorFromFile(file, Y);
    // Read norm
    ReadVectorFromFile(file, norm);
    // Read has label
    ReadDataFromDisk(file, (char*)&has_label, sizeof(has_label));
    // Read pos
    ReadDataFromDisk(file, (char*)&pos, sizeof(pos));
    Close(file);
  }